

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O1

void google::protobuf::json_internal::ParseProto2Descriptor::SetInt64(Field f,Msg *msg,int64_t x)

{
  byte bVar1;
  Descriptor *msg_00;
  Msg *msg_01;
  Msg *msg_02;
  string *__s;
  size_t __n;
  size_t sVar2;
  bool bVar3;
  uint value;
  uint32_t value_00;
  uint64_t value_01;
  Field pFVar4;
  Field f_00;
  MaybeOwnedString *this;
  Metadata MVar5;
  string_view sVar6;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  Msg *pMStack_b8;
  Field pFStack_88;
  Descriptor *pDStack_80;
  FileDescriptor *pFStack_58;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_29 aStack_50;
  Descriptor *pDStack_48;
  
  RecordAsSeen(f,msg);
  bVar1 = f->field_0x1;
  bVar3 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar3) {
    msg_00 = (Descriptor *)0x0;
  }
  else {
    msg_00 = (Descriptor *)
             absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar3,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (msg_00 == (Descriptor *)0x0) {
    bVar1 = f->field_0x1;
    MVar5 = Message::GetMetadata(msg->msg_);
    if ((bVar1 & 0x20) != 0) {
      Reflection::AddInt64(MVar5.reflection,msg->msg_,f,x);
      return;
    }
    Reflection::SetInt64(MVar5.reflection,msg->msg_,f,x);
    return;
  }
  pFVar4 = (Field)&stack0xffffffffffffffd0;
  SetInt64();
  pFStack_58 = (FileDescriptor *)x;
  aStack_50 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_29)f;
  pDStack_48 = (Descriptor *)msg;
  RecordAsSeen(pFVar4,(Msg *)msg_00);
  bVar1 = pFVar4->field_0x1;
  bVar3 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar3) {
    msg_01 = (Msg *)0x0;
  }
  else {
    msg_01 = (Msg *)absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar3,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (msg_01 != (Msg *)0x0) {
    f_00 = (Field)&stack0xffffffffffffff98;
    SetUInt64();
    pFStack_88 = pFVar4;
    pDStack_80 = msg_00;
    RecordAsSeen(f_00,msg_01);
    bVar1 = f_00->field_0x1;
    bVar3 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar3) {
      msg_02 = (Msg *)0x0;
    }
    else {
      msg_02 = (Msg *)absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar3,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (msg_02 == (Msg *)0x0) {
      bVar1 = f_00->field_0x1;
      MVar5 = Message::GetMetadata(msg_01->msg_);
      if ((bVar1 & 0x20) != 0) {
        Reflection::AddInt32(MVar5.reflection,msg_01->msg_,f_00,value);
        return;
      }
      Reflection::SetInt32(MVar5.reflection,msg_01->msg_,f_00,value);
      return;
    }
    pFVar4 = (Field)&stack0xffffffffffffff60;
    SetInt32();
    uStack_c8 = (ulong)value;
    uStack_c0 = f_00;
    pMStack_b8 = msg_01;
    RecordAsSeen(pFVar4,msg_02);
    bVar1 = pFVar4->field_0x1;
    bVar3 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar3) {
      __s = (string *)0x0;
    }
    else {
      __s = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                      (bVar3,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (__s != (string *)0x0) {
      this = (MaybeOwnedString *)&stack0xffffffffffffff28;
      SetUInt32();
      sVar6 = MaybeOwnedString::AsView(this);
      __n = sVar6._M_len;
      sVar2 = strlen((char *)__s);
      if ((__n == sVar2) && (__n != 0)) {
        bcmp(sVar6._M_str,__s,__n);
      }
      return;
    }
    bVar1 = pFVar4->field_0x1;
    MVar5 = Message::GetMetadata(msg_02->msg_);
    if ((bVar1 & 0x20) != 0) {
      Reflection::AddUInt32(MVar5.reflection,msg_02->msg_,pFVar4,value_00);
      return;
    }
    Reflection::SetUInt32(MVar5.reflection,msg_02->msg_,pFVar4,value_00);
    return;
  }
  bVar1 = pFVar4->field_0x1;
  MVar5 = Message::GetMetadata(*(Message **)msg_00);
  if ((bVar1 & 0x20) != 0) {
    Reflection::AddUInt64(MVar5.reflection,*(Message **)msg_00,pFVar4,value_01);
    return;
  }
  Reflection::SetUInt64(MVar5.reflection,*(Message **)msg_00,pFVar4,value_01);
  return;
}

Assistant:

static void SetInt64(Field f, Msg& msg, int64_t x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddInt64(msg.msg_, f, x);
    } else {
      msg.msg_->GetReflection()->SetInt64(msg.msg_, f, x);
    }
  }